

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int asn1_write_tagged_int(uchar **p,uchar *start,int val,int tag)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  size_t local_38;
  size_t len;
  int ret;
  int tag_local;
  int val_local;
  uchar *start_local;
  uchar **p_local;
  
  local_38 = 0;
  sVar3 = local_38;
  ret = val;
  do {
    local_38 = sVar3;
    if ((long)*p - (long)start < 1) {
      return -0x6c;
    }
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = (uchar)ret;
    ret = ret >> 8;
    sVar3 = local_38 + 1;
  } while (0 < ret);
  if ((**p & 0x80) != 0) {
    if ((long)*p - (long)start < 1) {
      return -0x6c;
    }
    puVar1 = *p;
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    sVar3 = local_38 + 2;
  }
  local_38 = sVar3;
  p_local._4_4_ = mbedtls_asn1_write_len(p,start,local_38);
  if (-1 < p_local._4_4_) {
    iVar2 = p_local._4_4_ + (int)local_38;
    p_local._4_4_ = mbedtls_asn1_write_tag(p,start,(uchar)tag);
    if (-1 < p_local._4_4_) {
      p_local._4_4_ = p_local._4_4_ + iVar2;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int asn1_write_tagged_int( unsigned char **p, unsigned char *start, int val, int tag )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    do
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        len += 1;
        *--(*p) = val & 0xff;
        val >>= 8;
    }
    while( val > 0 );

    if( **p & 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
        *--(*p) = 0x00;
        len += 1;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, tag ) );

    return( (int) len );
}